

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_7b5804::HandleDirectoryMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  bool bVar2;
  bool never;
  size_type sVar3;
  string *psVar4;
  size_type sVar5;
  cmGlobalGenerator *this_00;
  bool bVar6;
  ulong uVar7;
  _Base_ptr __args_2;
  int iVar8;
  bool exclude_from_all;
  bool optional;
  cmExecutionStatus *local_1f0;
  string destinationStr;
  string regex;
  cmAlphaNum local_198;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_168;
  _Base_ptr local_160;
  MessageLevel message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string literal_args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  string type;
  string component;
  Helper helper;
  string permissions_dir;
  string permissions_file;
  
  local_1f0 = status;
  Helper::Helper(&helper,status);
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  permissions_file._M_dataplus._M_p = (pointer)&permissions_file.field_2;
  permissions_file._M_string_length = 0;
  optional = false;
  exclude_from_all = false;
  permissions_file.field_2._M_local_buf[0] = '\0';
  permissions_dir._M_dataplus._M_p = (pointer)&permissions_dir.field_2;
  permissions_dir._M_string_length = 0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  permissions_dir.field_2._M_local_buf[0] = '\0';
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&component,(string *)&helper.DefaultComponentName);
  literal_args._M_dataplus._M_p = (pointer)&literal_args.field_2;
  literal_args._M_string_length = 0;
  bVar6 = false;
  literal_args.field_2._M_local_buf[0] = '\0';
  type._M_dataplus._M_p = (pointer)&type.field_2;
  type._M_string_length = 0;
  type.field_2._M_local_buf[0] = '\0';
  iVar8 = 1;
  never = false;
  local_160 = (_Base_ptr)0x0;
  for (uVar7 = 1; __args_2 = local_160,
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar7 = (ulong)((int)uVar7 + 1)) {
    bVar2 = std::operator==(pbVar1 + uVar7,"DESTINATION");
    if (bVar2) {
      iVar8 = 2;
      if (bVar6) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
        local_198.View_._M_len = (size_t)&DAT_00000011;
        local_198.View_._M_str = " does not allow \"";
        cmStrCat<std::__cxx11::string,char[26]>
                  (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                   (char (*) [26])"\" after PATTERN or REGEX.");
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
        goto LAB_0024c6e3;
      }
      goto LAB_0024bdd4;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7,"TYPE");
    if (bVar2) {
      iVar8 = 10;
      if (bVar6) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
        local_198.View_._M_len = (size_t)&DAT_00000011;
        local_198.View_._M_str = " does not allow \"";
        cmStrCat<std::__cxx11::string,char[26]>
                  (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                   (char (*) [26])"\" after PATTERN or REGEX.");
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
        goto LAB_0024c6e3;
      }
      goto LAB_0024bdd4;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7,"OPTIONAL");
    if (bVar2) {
      if (bVar6) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
        local_198.View_._M_len = (size_t)&DAT_00000011;
        local_198.View_._M_str = " does not allow \"";
        cmStrCat<std::__cxx11::string,char[26]>
                  (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                   (char (*) [26])"\" after PATTERN or REGEX.");
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
        goto LAB_0024c6e3;
      }
      optional = true;
      goto LAB_0024bdd1;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7,"MESSAGE_NEVER");
    if (bVar2) {
      if (!bVar6) {
        never = true;
        goto LAB_0024bdd1;
      }
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
      regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
      local_198.View_._M_len = (size_t)&DAT_00000011;
      local_198.View_._M_str = " does not allow \"";
      cmStrCat<std::__cxx11::string,char[26]>
                (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                 (char (*) [26])"\" after PATTERN or REGEX.");
      std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
      goto LAB_0024c6e3;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7,"PATTERN");
    if (bVar2) {
      iVar8 = 3;
LAB_0024be0d:
      bVar6 = true;
      goto LAB_0024bdd4;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7,"REGEX");
    if (bVar2) {
      iVar8 = 4;
      goto LAB_0024be0d;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7,"EXCLUDE");
    if (bVar2) {
      if ((iVar8 - 5U < 0xfffffffe) && (bVar6)) goto LAB_0024be4b;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
      regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
      local_198.View_._M_len = (size_t)&DAT_00000011;
      local_198.View_._M_str = " does not allow \"";
      cmStrCat<std::__cxx11::string,char[38]>
                (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                 (char (*) [38])"\" before a PATTERN or REGEX is given.");
      std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
LAB_0024c6e3:
      std::__cxx11::string::~string((string *)&destinationStr);
      bVar6 = false;
      goto LAB_0024c6ef;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7,"PERMISSIONS");
    if (bVar2) {
      if (bVar6) {
        std::__cxx11::string::append((char *)&literal_args);
        iVar8 = 7;
        goto LAB_0024bdd4;
      }
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
      regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
      local_198.View_._M_len = (size_t)&DAT_00000011;
      local_198.View_._M_str = " does not allow \"";
      cmStrCat<std::__cxx11::string,char[38]>
                (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                 (char (*) [38])"\" before a PATTERN or REGEX is given.");
      std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
      goto LAB_0024c6e3;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7,"FILE_PERMISSIONS");
    if (bVar2) {
      iVar8 = 5;
      if (!bVar6) goto LAB_0024bdd4;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
      regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
      local_198.View_._M_len = (size_t)&DAT_00000011;
      local_198.View_._M_str = " does not allow \"";
      cmStrCat<std::__cxx11::string,char[26]>
                (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                 (char (*) [26])"\" after PATTERN or REGEX.");
      std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
      goto LAB_0024c6e3;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7,
                            "DIRECTORY_PERMISSIONS");
    if (bVar2) {
      iVar8 = 6;
      if (!bVar6) goto LAB_0024bdd4;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
      regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
      local_198.View_._M_len = (size_t)&DAT_00000011;
      local_198.View_._M_str = " does not allow \"";
      cmStrCat<std::__cxx11::string,char[26]>
                (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                 (char (*) [26])"\" after PATTERN or REGEX.");
      std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
      goto LAB_0024c6e3;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7,
                            "USE_SOURCE_PERMISSIONS");
    if (bVar2) {
      if (!bVar6) {
LAB_0024be4b:
        std::__cxx11::string::append((char *)&literal_args);
        goto LAB_0024bdd1;
      }
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
      regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
      local_198.View_._M_len = (size_t)&DAT_00000011;
      local_198.View_._M_str = " does not allow \"";
      cmStrCat<std::__cxx11::string,char[26]>
                (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                 (char (*) [26])"\" after PATTERN or REGEX.");
      std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
      goto LAB_0024c6e3;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7,"FILES_MATCHING");
    if (bVar2) {
      if (!bVar6) goto LAB_0024be4b;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
      regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
      local_198.View_._M_len = (size_t)&DAT_00000011;
      local_198.View_._M_str = " does not allow \"";
      cmStrCat<std::__cxx11::string,char[26]>
                (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                 (char (*) [26])"\" after PATTERN or REGEX.");
      std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
      goto LAB_0024c6e3;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7,"CONFIGURATIONS");
    if (bVar2) {
      iVar8 = 8;
      if (!bVar6) goto LAB_0024bdd4;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
      regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
      local_198.View_._M_len = (size_t)&DAT_00000011;
      local_198.View_._M_str = " does not allow \"";
      cmStrCat<std::__cxx11::string,char[26]>
                (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                 (char (*) [26])"\" after PATTERN or REGEX.");
      std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
      goto LAB_0024c6e3;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7,"COMPONENT");
    if (bVar2) {
      iVar8 = 9;
      if (!bVar6) goto LAB_0024bdd4;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
      regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
      local_198.View_._M_len = (size_t)&DAT_00000011;
      local_198.View_._M_str = " does not allow \"";
      cmStrCat<std::__cxx11::string,char[26]>
                (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                 (char (*) [26])"\" after PATTERN or REGEX.");
      std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
      goto LAB_0024c6e3;
    }
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + uVar7,"EXCLUDE_FROM_ALL");
    if (bVar2) {
      if (!bVar6) {
        exclude_from_all = true;
        goto LAB_0024bdd1;
      }
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
      regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
      local_198.View_._M_len = (size_t)&DAT_00000011;
      local_198.View_._M_str = " does not allow \"";
      cmStrCat<std::__cxx11::string,char[26]>
                (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                 (char (*) [26])"\" after PATTERN or REGEX.");
      std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
      goto LAB_0024c6e3;
    }
    if (9 < iVar8 - 1U) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
      regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
      local_198.View_._M_len = 0x19;
      local_198.View_._M_str = " given unknown argument \"";
      cmStrCat<std::__cxx11::string,char[3]>
                (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                 (char (*) [3])0x5cc634);
      std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
      goto LAB_0024c6e3;
    }
    psVar4 = &component;
    switch(iVar8) {
    case 1:
      std::__cxx11::string::string
                ((string *)&destinationStr,
                 (string *)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar7));
      sVar3 = cmGeneratorExpression::Find(&destinationStr);
      if ((sVar3 != 0) && (bVar2 = cmsys::SystemTools::FileIsFullPath(&destinationStr), !bVar2)) {
        psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(helper.Makefile);
        regex._M_string_length = (size_type)(psVar4->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)psVar4->_M_string_length;
        local_198.View_._M_len = 1;
        local_198.View_._M_str = local_198.Digits_;
        local_198.Digits_[0] = '/';
        cmStrCat<std::__cxx11::string>
                  ((string *)&message,(cmAlphaNum *)&regex,&local_198,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar7);
        std::__cxx11::string::operator=((string *)&destinationStr,(string *)&message);
        std::__cxx11::string::~string((string *)&message);
      }
      bVar2 = cmsys::SystemTools::FileExists(&destinationStr);
      if ((bVar2) && (bVar2 = cmsys::SystemTools::FileIsDirectory(&destinationStr), !bVar2)) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
        local_198.View_._M_len = 0x16;
        local_198.View_._M_str = " given non-directory \"";
        cmStrCat<std::__cxx11::string,char[14]>
                  ((string *)&message,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                   (char (*) [14])"\" to install.");
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
        std::__cxx11::string::~string((string *)&message);
        goto LAB_0024c6e3;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&dirs,
                 &destinationStr);
      std::__cxx11::string::~string((string *)&destinationStr);
      iVar8 = 1;
      break;
    case 2:
      local_160 = (_Base_ptr)
                  ((args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar7);
      iVar8 = 0;
      break;
    case 3:
      std::__cxx11::string::append((char *)&literal_args);
      cmsys::Glob::PatternToRegex
                (&regex,(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar7,false,false);
      cmsys::SystemTools::ReplaceString(&regex,"\\","\\\\");
      std::__cxx11::string::append((string *)&literal_args);
      std::__cxx11::string::append((char *)&literal_args);
      goto LAB_0024c1f6;
    case 4:
      std::__cxx11::string::append((char *)&literal_args);
      std::__cxx11::string::string
                ((string *)&regex,
                 (string *)
                 ((args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar7));
      cmsys::SystemTools::ReplaceString(&regex,"\\","\\\\");
      std::__cxx11::string::append((string *)&literal_args);
      std::__cxx11::string::append((char *)&literal_args);
LAB_0024c1f6:
      std::__cxx11::string::~string((string *)&regex);
LAB_0024bdd1:
      iVar8 = 0;
      break;
    case 5:
      bVar2 = cmInstallCommandArguments::CheckPermissions
                        ((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar7,&permissions_file);
      iVar8 = 5;
      if (!bVar2) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
        local_198.View_._M_len = 0x20;
        local_198.View_._M_str = " given invalid file permission \"";
        cmStrCat<std::__cxx11::string,char[3]>
                  (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                   (char (*) [3])0x5cc634);
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
        goto LAB_0024c6e3;
      }
      break;
    case 6:
      bVar2 = cmInstallCommandArguments::CheckPermissions
                        ((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar7,&permissions_dir);
      iVar8 = 6;
      if (!bVar2) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
        local_198.View_._M_len = 0x25;
        local_198.View_._M_str = " given invalid directory permission \"";
        cmStrCat<std::__cxx11::string,char[3]>
                  (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                   (char (*) [3])0x5cc634);
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
        goto LAB_0024c6e3;
      }
      break;
    case 7:
      bVar2 = cmInstallCommandArguments::CheckPermissions
                        ((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar7,&literal_args);
      iVar8 = 7;
      if (!bVar2) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
        local_198.View_._M_len = (size_t)&DAT_0000001b;
        local_198.View_._M_str = " given invalid permission \"";
        cmStrCat<std::__cxx11::string,char[3]>
                  (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                   (char (*) [3])0x5cc634);
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
        goto LAB_0024c6e3;
      }
      break;
    case 8:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&configurations,
                  (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + uVar7);
      iVar8 = 8;
      break;
    case 9:
      goto switchD_0024bfed_caseD_9;
    case 10:
      sVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(anonymous_namespace)::allowedTypes_abi_cxx11_,
                      (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar7);
      psVar4 = &type;
      if (sVar5 == 0) {
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
        local_198.View_._M_len = (size_t)&DAT_00000011;
        local_198.View_._M_str = " given non-type \"";
        cmStrCat<std::__cxx11::string,char[22]>
                  (&destinationStr,(cmAlphaNum *)&regex,&local_198,pbVar1 + uVar7,
                   (char (*) [22])"\" with TYPE argument.");
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
        goto LAB_0024c6e3;
      }
      goto switchD_0024bfed_caseD_9;
    }
LAB_0024bdd4:
  }
  if ((dirs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       dirs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (local_160 != (_Base_ptr)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(&dirs);
  }
  if (dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar6 = true;
    goto LAB_0024c6ef;
  }
  destinationStr._M_dataplus._M_p = (pointer)&destinationStr.field_2;
  destinationStr._M_string_length = 0;
  destinationStr.field_2._M_local_buf[0] = '\0';
  if (__args_2 == (_Base_ptr)0x0) {
    if (type._M_string_length == 0) {
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
      regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
      local_198.View_._M_len = 0x16;
      local_198.View_._M_str = " given no DESTINATION!";
      cmStrCat<>((string *)&message,(cmAlphaNum *)&regex,&local_198);
      std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
      goto LAB_0024c671;
    }
    Helper::GetDestinationForType(&regex,&helper,(cmInstallCommandArguments *)0x0,&type);
    __args_2 = (_Base_ptr)&destinationStr;
    std::__cxx11::string::operator=((string *)__args_2,(string *)&regex);
    std::__cxx11::string::~string((string *)&regex);
LAB_0024c4b4:
    message = cmInstallGenerator::SelectMessageLevel(helper.Makefile,never);
    this = helper.Makefile;
    cmMakefile::GetBacktrace((cmMakefile *)&regex);
    std::
    make_unique<cmInstallDirectoryGenerator,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&,cmInstallGenerator::MessageLevel&,bool&,std::__cxx11::string&,bool&,cmListFileBacktrace>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_198,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dirs,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_2,
               &permissions_file,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&permissions_dir,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&configurations,
               (MessageLevel *)&component,(bool *)&message,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &exclude_from_all,(bool *)&literal_args,(cmListFileBacktrace *)&optional);
    local_168._M_head_impl = (cmInstallGenerator *)local_198.View_._M_len;
    local_198.View_._M_len = 0;
    cmMakefile::AddInstallGenerator
              (this,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                    &local_168);
    if (local_168._M_head_impl != (cmInstallGenerator *)0x0) {
      (*(code *)((((_Vector_impl *)
                  &((local_168._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator)->
                 super__Vector_impl_data)._M_start)->_M_string_length)();
    }
    local_168._M_head_impl = (cmInstallGenerator *)0x0;
    if ((_Elt_pointer)local_198.View_._M_len != (_Elt_pointer)0x0) {
      (*(code *)((((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_198.View_._M_len)->_M_impl).super__Vector_impl_data._M_start)->
                _M_string_length)();
    }
    local_198.View_._M_len = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&regex._M_string_length);
    this_00 = cmMakefile::GetGlobalGenerator(helper.Makefile);
    cmGlobalGenerator::AddInstallComponent(this_00,&component);
    bVar6 = true;
  }
  else {
    if (type._M_string_length == 0) goto LAB_0024c4b4;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    regex._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
    regex._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
    local_198.View_._M_len = (size_t)&DAT_00000045;
    local_198.View_._M_str = " given both TYPE and DESTINATION arguments. You may only specify one."
    ;
    cmStrCat<>((string *)&message,(cmAlphaNum *)&regex,&local_198);
    std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
LAB_0024c671:
    std::__cxx11::string::~string((string *)&message);
    bVar6 = false;
  }
  std::__cxx11::string::~string((string *)&destinationStr);
LAB_0024c6ef:
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&literal_args);
  std::__cxx11::string::~string((string *)&component);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configurations);
  std::__cxx11::string::~string((string *)&permissions_dir);
  std::__cxx11::string::~string((string *)&permissions_file);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&dirs);
  std::__cxx11::string::~string((string *)&helper.DefaultComponentName);
  return bVar6;
switchD_0024bfed_caseD_9:
  std::__cxx11::string::_M_assign((string *)psVar4);
  goto LAB_0024bdd1;
}

Assistant:

bool HandleDirectoryMode(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  Helper helper(status);

  enum Doing
  {
    DoingNone,
    DoingDirs,
    DoingDestination,
    DoingPattern,
    DoingRegex,
    DoingPermsFile,
    DoingPermsDir,
    DoingPermsMatch,
    DoingConfigurations,
    DoingComponent,
    DoingType
  };
  Doing doing = DoingDirs;
  bool in_match_mode = false;
  bool optional = false;
  bool exclude_from_all = false;
  bool message_never = false;
  std::vector<std::string> dirs;
  const std::string* destination = nullptr;
  std::string permissions_file;
  std::string permissions_dir;
  std::vector<std::string> configurations;
  std::string component = helper.DefaultComponentName;
  std::string literal_args;
  std::string type;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "DESTINATION") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the destination property.
      doing = DoingDestination;
    } else if (args[i] == "TYPE") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the type.
      doing = DoingType;
    } else if (args[i] == "OPTIONAL") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Mark the rule as optional.
      optional = true;
      doing = DoingNone;
    } else if (args[i] == "MESSAGE_NEVER") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Mark the rule as quiet.
      message_never = true;
      doing = DoingNone;
    } else if (args[i] == "PATTERN") {
      // Switch to a new pattern match rule.
      doing = DoingPattern;
      in_match_mode = true;
    } else if (args[i] == "REGEX") {
      // Switch to a new regex match rule.
      doing = DoingRegex;
      in_match_mode = true;
    } else if (args[i] == "EXCLUDE") {
      // Add this property to the current match rule.
      if (!in_match_mode || doing == DoingPattern || doing == DoingRegex) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" before a PATTERN or REGEX is given."));
        return false;
      }
      literal_args += " EXCLUDE";
      doing = DoingNone;
    } else if (args[i] == "PERMISSIONS") {
      if (!in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" before a PATTERN or REGEX is given."));
        return false;
      }

      // Switch to setting the current match permissions property.
      literal_args += " PERMISSIONS";
      doing = DoingPermsMatch;
    } else if (args[i] == "FILE_PERMISSIONS") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the file permissions property.
      doing = DoingPermsFile;
    } else if (args[i] == "DIRECTORY_PERMISSIONS") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the directory permissions property.
      doing = DoingPermsDir;
    } else if (args[i] == "USE_SOURCE_PERMISSIONS") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Add this option literally.
      literal_args += " USE_SOURCE_PERMISSIONS";
      doing = DoingNone;
    } else if (args[i] == "FILES_MATCHING") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Add this option literally.
      literal_args += " FILES_MATCHING";
      doing = DoingNone;
    } else if (args[i] == "CONFIGURATIONS") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the configurations property.
      doing = DoingConfigurations;
    } else if (args[i] == "COMPONENT") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the component property.
      doing = DoingComponent;
    } else if (args[i] == "EXCLUDE_FROM_ALL") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }
      exclude_from_all = true;
      doing = DoingNone;
    } else if (doing == DoingDirs) {
      // Convert this directory to a full path.
      std::string dir = args[i];
      std::string::size_type gpos = cmGeneratorExpression::Find(dir);
      if (gpos != 0 && !cmSystemTools::FileIsFullPath(dir)) {
        dir =
          cmStrCat(helper.Makefile->GetCurrentSourceDirectory(), '/', args[i]);
      }

      // Make sure the name is a directory.
      if (cmSystemTools::FileExists(dir) &&
          !cmSystemTools::FileIsDirectory(dir)) {
        status.SetError(cmStrCat(args[0], " given non-directory \"", args[i],
                                 "\" to install."));
        return false;
      }

      // Store the directory for installation.
      dirs.push_back(std::move(dir));
    } else if (doing == DoingConfigurations) {
      configurations.push_back(args[i]);
    } else if (doing == DoingDestination) {
      destination = &args[i];
      doing = DoingNone;
    } else if (doing == DoingType) {
      if (allowedTypes.count(args[i]) == 0) {
        status.SetError(cmStrCat(args[0], " given non-type \"", args[i],
                                 "\" with TYPE argument."));
        return false;
      }

      type = args[i];
      doing = DoingNone;
    } else if (doing == DoingPattern) {
      // Convert the pattern to a regular expression.  Require a
      // leading slash and trailing end-of-string in the matched
      // string to make sure the pattern matches only whole file
      // names.
      literal_args += " REGEX \"/";
      std::string regex = cmsys::Glob::PatternToRegex(args[i], false);
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "$\"";
      doing = DoingNone;
    } else if (doing == DoingRegex) {
      literal_args += " REGEX \"";
// Match rules are case-insensitive on some platforms.
#if defined(_WIN32) || defined(__APPLE__)
      std::string regex = cmSystemTools::LowerCase(args[i]);
#else
      std::string regex = args[i];
#endif
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "\"";
      doing = DoingNone;
    } else if (doing == DoingComponent) {
      component = args[i];
      doing = DoingNone;
    } else if (doing == DoingPermsFile) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       permissions_file)) {
        status.SetError(cmStrCat(args[0], " given invalid file permission \"",
                                 args[i], "\"."));
        return false;
      }
    } else if (doing == DoingPermsDir) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       permissions_dir)) {
        status.SetError(cmStrCat(
          args[0], " given invalid directory permission \"", args[i], "\"."));
        return false;
      }
    } else if (doing == DoingPermsMatch) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       literal_args)) {
        status.SetError(
          cmStrCat(args[0], " given invalid permission \"", args[i], "\"."));
        return false;
      }
    } else {
      // Unknown argument.
      status.SetError(
        cmStrCat(args[0], " given unknown argument \"", args[i], "\"."));
      return false;
    }
  }

  // Support installing an empty directory.
  if (dirs.empty() && destination) {
    dirs.emplace_back();
  }

  // Check if there is something to do.
  if (dirs.empty()) {
    return true;
  }
  std::string destinationStr;
  if (!destination) {
    if (type.empty()) {
      // A destination is required.
      status.SetError(cmStrCat(args[0], " given no DESTINATION!"));
      return false;
    }
    destinationStr = helper.GetDestinationForType(nullptr, type);
    destination = &destinationStr;
  } else if (!type.empty()) {
    status.SetError(cmStrCat(args[0],
                             " given both TYPE and DESTINATION "
                             "arguments. You may only specify one."));
    return false;
  }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(helper.Makefile, message_never);

  // Create the directory install generator.
  helper.Makefile->AddInstallGenerator(
    cm::make_unique<cmInstallDirectoryGenerator>(
      dirs, *destination, permissions_file, permissions_dir, configurations,
      component, message, exclude_from_all, literal_args, optional,
      helper.Makefile->GetBacktrace()));

  // Tell the global generator about any installation component names
  // specified.
  helper.Makefile->GetGlobalGenerator()->AddInstallComponent(component);

  return true;
}